

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O3

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
::_adjRemoveRefs(HeadNode<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
                 *this,size_t level,
                Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
                *pNode)

{
  ulong uVar1;
  pointer pNVar2;
  Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
  *pNVar3;
  size_t sVar4;
  size_t sVar5;
  pointer pNVar6;
  pointer pNVar7;
  size_t *psVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  uVar11 = level << 4 | 8;
  do {
    pNVar6 = (this->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar7 = (this->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar9 = (long)pNVar7 - (long)pNVar6 >> 4;
    if (uVar9 <= level) goto LAB_00e3ae13;
    uVar1 = (pNode->_nodeRefs)._swapLevel;
    pNVar2 = (pNode->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pNode->_nodeRefs)._nodes.
                      super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 4) <= uVar1)
    goto LAB_00e3ae13;
    *(long *)((long)&pNVar2->pNode + uVar11) =
         *(long *)((long)&pNVar6->pNode + uVar11) + *(long *)((long)&pNVar2->pNode + uVar11) + -1;
    pNVar3 = pNVar6[uVar1].pNode;
    sVar4 = pNVar6[uVar1].width;
    sVar5 = pNVar2[uVar1].width;
    pNVar6[uVar1].pNode = pNVar2[uVar1].pNode;
    pNVar6[uVar1].width = sVar5;
    pNVar6 = (pNode->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + (pNode->_nodeRefs)._swapLevel;
    pNVar6->pNode = pNVar3;
    pNVar6->width = sVar4;
    uVar9 = (pNode->_nodeRefs)._swapLevel + 1;
    (pNode->_nodeRefs)._swapLevel = uVar9;
    level = level + 1;
    uVar11 = uVar11 + 0x10;
  } while (uVar9 < (ulong)((long)(pNode->_nodeRefs)._nodes.
                                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pNode->_nodeRefs)._nodes.
                                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
  pNVar6 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar7 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (long)pNVar7 - (long)pNVar6 >> 4;
LAB_00e3ae13:
  lVar10 = uVar9 - level;
  pNVar2 = pNVar7;
  if (level <= uVar9 && lVar10 != 0) {
    psVar8 = &pNVar6[level].width;
    do {
      *psVar8 = *psVar8 - 1;
      psVar8 = psVar8 + 2;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  while ((pNVar7 != pNVar6 &&
         (pNVar2[-1].pNode ==
          (Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
           *)0x0))) {
    pNVar7 = pNVar7 + -1;
    (this->_nodeRefs)._nodes.
    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar7;
    pNVar2 = pNVar2 + -1;
  }
  return;
}

Assistant:

void HeadNode<T, _Compare>::_adjRemoveRefs(size_t level,
                                           Node<T, _Compare> *pNode) {
    assert(pNode);
    SwappableNodeRefStack<T, _Compare> &thatRefs = pNode->nodeRefs();

    // Swap all remaining levels
    // This assertion checks that if swapping can take place we must be at the
    // same level.
    assert(! thatRefs.canSwap() || level == thatRefs.swapLevel());
    while (level < _nodeRefs.height() && thatRefs.canSwap()) {
        assert(level == thatRefs.swapLevel());
        // Compute the new width for the new node
        thatRefs[level].width += _nodeRefs[level].width - 1;
        thatRefs.swap(_nodeRefs);
        ++level;
        if (! thatRefs.canSwap()) {
            break;
        }
    }
    assert(! thatRefs.canSwap());
    // Decrement my widths as my references are now going over the top of
    // pNode.
    while (level < _nodeRefs.height()) {
        _nodeRefs[level++].width -= 1;
    }
    // Decrement my stack while top has a NULL pointer.
    while (_nodeRefs.height() && ! _nodeRefs[_nodeRefs.height() - 1].pNode) {
        _nodeRefs.pop_back();
    }
}